

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O2

void __thiscall Fl_File_Chooser::~Fl_File_Chooser(Fl_File_Chooser *this)

{
  Fl::remove_timeout(previewCB,this);
  if (this->ext_group != (Fl_Widget *)0x0) {
    Fl_Group::remove((Fl_Group *)this->window,(char *)this->ext_group);
  }
  if (this->window != (Fl_Double_Window *)0x0) {
    (*(this->window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
  }
  if (this->favWindow != (Fl_Double_Window *)0x0) {
    (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])();
    return;
  }
  return;
}

Assistant:

Fl_File_Chooser::~Fl_File_Chooser() {
  Fl::remove_timeout((Fl_Timeout_Handler)previewCB, this);
  if(ext_group)window->remove(ext_group);
  delete window;
  delete favWindow;
}